

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicAllTargetsAtomic::Atomic<int>
          (BasicAllTargetsAtomic *this,GLenum internalformat)

{
  byte bVar1;
  GLenum GVar2;
  bool bVar3;
  GLuint GVar4;
  GLenum GVar5;
  GLenum GVar6;
  GLint GVar7;
  char *src_fs;
  reference pvVar8;
  CallLogWrapper *pCVar9;
  Vector<float,_4> local_ac;
  byte local_9a;
  allocator<int> local_99;
  undefined1 local_98 [6];
  bool status;
  vector<int,_std::allocator<int>_> data;
  int kSize;
  GLuint buffer;
  GLuint textures [7];
  string local_48;
  GLuint local_24;
  char *pcStack_20;
  GLuint program;
  char *src_vs;
  BasicAllTargetsAtomic *pBStack_10;
  GLenum internalformat_local;
  BasicAllTargetsAtomic *this_local;
  
  pcStack_20 = 
  "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
  ;
  src_vs._4_4_ = internalformat;
  pBStack_10 = this;
  GenFS<int>(&local_48,this,internalformat);
  src_fs = (char *)std::__cxx11::string::c_str();
  GVar4 = ShaderImageLoadStoreBase::BuildProgram
                    (&this->super_ShaderImageLoadStoreBase,
                     "#version 420 core\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                     ,(char *)0x0,(char *)0x0,(char *)0x0,src_fs,(bool *)0x0);
  std::__cxx11::string::~string((string *)&local_48);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  local_24 = GVar4;
  glu::CallLogWrapper::glGenTextures(pCVar9,7,(GLuint *)&kSize);
  glu::CallLogWrapper::glGenBuffers
            (pCVar9,1,(GLuint *)
                      ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 4));
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x10;
  std::allocator<int>::allocator(&local_99);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_98,0x200,&local_99);
  std::allocator<int>::~allocator(&local_99);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde0,kSize);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde0,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde0,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage1D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde0,0,GVar2,0x10,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde0,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,buffer);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0xde1,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x806f,textures[0]);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x806f,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x806f,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage3D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x806f,0,GVar2,0x10,0x10,2,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x806f,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x84f5,textures[1]);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x84f5,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x84f5,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x84f5,0,GVar2,0x10,0x10,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x84f5,0);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,0x40,pvVar8,0x88e8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,textures[2]);
  glu::CallLogWrapper::glTexBuffer
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,src_vs._4_4_,
             data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c2a,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c18,textures[3]);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c18,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c18,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage2D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c18,0,GVar2,0x10,2,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c18,0);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,textures[4]);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0x2800,0x2600);
  GVar2 = src_vs._4_4_;
  GVar5 = ShaderImageLoadStoreBase::Format<int>(&this->super_ShaderImageLoadStoreBase);
  GVar6 = ShaderImageLoadStoreBase::Type<int>(&this->super_ShaderImageLoadStoreBase);
  pvVar8 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_98,0);
  glu::CallLogWrapper::glTexImage3D
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0,GVar2,0x10,0x10,2,0,GVar5,GVar6,pvVar8);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x8c1a,0);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,kSize,0,'\0',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,buffer,0,'\0',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,2,textures[0],0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,3,textures[1],0,'\0',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,4,textures[2],0,'\0',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,textures[3],0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glBindImageTexture
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,6,textures[4],0,'\x01',0,0x88ba,src_vs._4_4_);
  glu::CallLogWrapper::glClear
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0x4000);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_1d");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,0);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_2d");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,1);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_3d");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,2);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_2drect");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,3);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_buffer");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,4);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_1darray");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,5);
  pCVar9 = &(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
            super_CallLogWrapper;
  GVar7 = glu::CallLogWrapper::glGetUniformLocation(pCVar9,local_24,"g_image_2darray");
  glu::CallLogWrapper::glUniform1i(pCVar9,GVar7,6);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glViewport
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0,0,0x10,1);
  glu::CallLogWrapper::glDrawArrays
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,5,0,4);
  local_9a = 1;
  tcu::Vector<float,_4>::Vector(&local_ac,0.0,1.0,0.0,1.0);
  bVar3 = ShaderImageLoadStoreBase::ValidateReadBuffer
                    (&this->super_ShaderImageLoadStoreBase,0,0,0x10,1,&local_ac);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    local_9a = 0;
  }
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,0);
  glu::CallLogWrapper::glDeleteProgram
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,local_24);
  glu::CallLogWrapper::glDeleteTextures
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,7,(GLuint *)&kSize);
  glu::CallLogWrapper::glDeleteBuffers
            (&(this->super_ShaderImageLoadStoreBase).super_SubcaseBase.super_GLWrapper.
              super_CallLogWrapper,1,
             (GLuint *)
             ((long)&data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 4));
  bVar1 = local_9a;
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_98);
  return (bool)(bVar1 & 1);
}

Assistant:

bool Atomic(GLenum internalformat)
	{
		const char* src_vs = "#version 420 core" NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL
							 "  gl_Position = i_position;" NL "}";
		const GLuint program = BuildProgram(src_vs, NULL, NULL, NULL, GenFS<T>(internalformat).c_str());
		GLuint		 textures[7];
		GLuint		 buffer;
		glGenTextures(7, textures);
		glGenBuffers(1, &buffer);

		const int	  kSize = 16;
		std::vector<T> data(kSize * kSize * 2);

		glBindTexture(GL_TEXTURE_1D, textures[0]);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage1D(GL_TEXTURE_1D, 0, internalformat, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D, 0);

		glBindTexture(GL_TEXTURE_2D, textures[1]);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_2D, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindTexture(GL_TEXTURE_3D, textures[2]);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_3D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_3D, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_3D, 0);

		glBindTexture(GL_TEXTURE_RECTANGLE, textures[3]);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_RECTANGLE, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_RECTANGLE, 0, internalformat, kSize, kSize, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_RECTANGLE, 0);

		glBindBuffer(GL_TEXTURE_BUFFER, buffer);
		glBufferData(GL_TEXTURE_BUFFER, kSize * sizeof(T), &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_TEXTURE_BUFFER, 0);
		glBindTexture(GL_TEXTURE_BUFFER, textures[4]);
		glTexBuffer(GL_TEXTURE_BUFFER, internalformat, buffer);
		glBindTexture(GL_TEXTURE_BUFFER, 0);

		glBindTexture(GL_TEXTURE_1D_ARRAY, textures[5]);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_1D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage2D(GL_TEXTURE_1D_ARRAY, 0, internalformat, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_1D_ARRAY, 0);

		glBindTexture(GL_TEXTURE_2D_ARRAY, textures[6]);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, internalformat, kSize, kSize, 2, 0, Format<T>(), Type<T>(), &data[0]);
		glBindTexture(GL_TEXTURE_2D_ARRAY, 0);

		glBindImageTexture(0, textures[0], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(1, textures[1], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(2, textures[2], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(3, textures[3], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(4, textures[4], 0, GL_FALSE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(5, textures[5], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);
		glBindImageTexture(6, textures[6], 0, GL_TRUE, 0, GL_READ_WRITE, internalformat);

		glClear(GL_COLOR_BUFFER_BIT);

		glUseProgram(program);
		glUniform1i(glGetUniformLocation(program, "g_image_1d"), 0);
		glUniform1i(glGetUniformLocation(program, "g_image_2d"), 1);
		glUniform1i(glGetUniformLocation(program, "g_image_3d"), 2);
		glUniform1i(glGetUniformLocation(program, "g_image_2drect"), 3);
		glUniform1i(glGetUniformLocation(program, "g_image_buffer"), 4);
		glUniform1i(glGetUniformLocation(program, "g_image_1darray"), 5);
		glUniform1i(glGetUniformLocation(program, "g_image_2darray"), 6);

		glBindVertexArray(m_vao);
		glViewport(0, 0, kSize, 1);
		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);

		bool status = true;

		if (!ValidateReadBuffer(0, 0, kSize, 1, vec4(0, 1, 0, 1)))
		{
			status = false;
		}

		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(7, textures);
		glDeleteBuffers(1, &buffer);

		return status;
	}